

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

void ON_SubD::AutomaticMeshToSubDRestoreDefaults(AutomaticMeshToSubDContext context)

{
  undefined3 in_register_00000039;
  
  if (CONCAT31(in_register_00000039,context) != 1) {
    if (CONCAT31(in_register_00000039,context) != 2) {
      AutomaticRhino5BoxModeTSplineToSubD = true;
    }
    AutomaticFBXMeshWithDivisionLevelsToSubD = false;
    return;
  }
  AutomaticRhino5BoxModeTSplineToSubD = true;
  return;
}

Assistant:

void ON_SubD::AutomaticMeshToSubDRestoreDefaults(
  ON_SubD::AutomaticMeshToSubDContext context
  )
{
  switch (context)
  {
  case ON_SubD::AutomaticMeshToSubDContext::Unset:
  default:
    ON_SubD::AutomaticRhino5BoxModeTSplineToSubD = ON_SubD::AutomaticRhino5BoxModeTSplineToSubDDefault;
    ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubD = ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubDDefault;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::Rhino5BoxModeTSpline:
    ON_SubD::AutomaticRhino5BoxModeTSplineToSubD = ON_SubD::AutomaticRhino5BoxModeTSplineToSubDDefault;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::FBXMeshWithDivisionLevels:
    ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubD = ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubDDefault;
    break;
  }
}